

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgesture.cpp
# Opt level: O3

bool __thiscall QGestureEvent::isAccepted(QGestureEvent *this,QGesture *gesture)

{
  bool bVar1;
  long in_FS_OFFSET;
  bool local_d;
  GestureType local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (gesture == (QGesture *)0x0) {
    bVar1 = false;
  }
  else {
    local_c = *(GestureType *)(*(long *)&gesture->field_0x8 + 0x78);
    local_d = true;
    bVar1 = QMap<Qt::GestureType,_bool>::value(&this->m_accepted,&local_c,&local_d);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QGestureEvent::isAccepted(QGesture *gesture) const
{
    return gesture ? isAccepted(gesture->gestureType()) : false;
}